

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.cpp
# Opt level: O3

void __thiscall HighsIis::invalidate(HighsIis *this)

{
  pointer piVar1;
  pointer pHVar2;
  
  this->valid_ = false;
  this->strategy_ = 0;
  piVar1 = (this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->col_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar1;
  }
  piVar1 = (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->row_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar1;
  }
  piVar1 = (this->col_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->col_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->col_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar1;
  }
  piVar1 = (this->row_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->row_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar1) {
    (this->row_bound_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar1;
  }
  pHVar2 = (this->info_).super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->info_).super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
      super__Vector_impl_data._M_finish != pHVar2) {
    (this->info_).super__Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = pHVar2;
  }
  return;
}

Assistant:

void HighsIis::invalidate() {
  this->valid_ = false;
  this->strategy_ = kIisStrategyMin;
  this->col_index_.clear();
  this->row_index_.clear();
  this->col_bound_.clear();
  this->row_bound_.clear();
  this->info_.clear();
}